

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O3

int md_is_table_underline(MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET *p_end,uint *p_col_count)

{
  MD_CHAR *pMVar1;
  _func_void_char_ptr_void_ptr *p_Var2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  char *pcVar14;
  
  uVar11 = ctx->size;
  uVar4 = 0;
  if (beg < uVar11) {
    if (ctx->text[beg] == '|') {
      uVar9 = (ulong)(beg + 1);
      bVar3 = true;
      uVar10 = uVar9;
      if (beg + 1 < uVar11) {
        pbVar12 = (byte *)(ctx->text + beg);
        do {
          pbVar12 = pbVar12 + 1;
          uVar10 = uVar9;
          if ((0x20 < (ulong)*pbVar12) || ((0x100001a00U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0))
          break;
          uVar6 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar6;
          uVar10 = (ulong)uVar11;
        } while (uVar11 != uVar6);
      }
      goto LAB_005c92d7;
    }
  }
  bVar3 = false;
  uVar10 = (ulong)beg;
LAB_005c92d7:
  do {
    uVar6 = (uint)uVar10;
    if (uVar6 < uVar11) {
      uVar6 = (ctx->text[uVar10 & 0xffffffff] == ':') + uVar6;
    }
    if (uVar11 <= uVar6) {
      return 0;
    }
    pMVar1 = ctx->text;
    if (pMVar1[uVar6] != '-') {
      return 0;
    }
    iVar7 = -uVar6;
    pcVar14 = pMVar1 + uVar6;
    do {
      if (*pcVar14 != '-') {
        uVar6 = (uint)(*pcVar14 == ':') - iVar7;
        break;
      }
      iVar7 = iVar7 + -1;
      pcVar14 = pcVar14 + 1;
      uVar6 = uVar11;
    } while (uVar11 + iVar7 != 0);
    uVar9 = (ulong)uVar6;
    if (uVar4 == 0x80) {
      p_Var2 = (ctx->parser).debug_log;
      if (p_Var2 == (_func_void_char_ptr_void_ptr *)0x0) {
        return 0;
      }
      (*p_Var2)("Suppressing table (column_count >128)",ctx->userdata);
      return 0;
    }
    uVar4 = uVar4 + 1;
    bVar5 = true;
    uVar10 = uVar9;
    if (uVar6 < uVar11) {
      lVar13 = 0;
      while (((ulong)(byte)pMVar1[lVar13 + uVar9] < 0x21 &&
             ((0x100001a00U >> ((ulong)(byte)pMVar1[lVar13 + uVar9] & 0x3f) & 1) != 0))) {
        lVar13 = lVar13 + 1;
        uVar8 = uVar11;
        if ((uVar6 - uVar11) + (int)lVar13 == 0) goto LAB_005c93e9;
      }
      uVar10 = uVar9 + lVar13;
      if (pMVar1[uVar10 & 0xffffffff] == '|') {
        uVar10 = uVar9 + lVar13 + 1;
        if ((uint)uVar10 < uVar11) {
          uVar10 = uVar10 & 0xffffffff;
          while (((ulong)(byte)pMVar1[uVar10] < 0x21 &&
                 ((0x100001a00U >> ((ulong)(byte)pMVar1[uVar10] & 0x3f) & 1) != 0))) {
            uVar10 = uVar10 + 1;
            if (uVar11 <= uVar10) goto LAB_005c93ed;
          }
        }
        bVar3 = true;
        bVar5 = false;
      }
    }
    uVar8 = (uint)uVar10;
    if (((uVar11 <= uVar8) || (pMVar1[uVar10 & 0xffffffff] == '\n')) ||
       (pMVar1[uVar10 & 0xffffffff] == '\r')) {
LAB_005c93e9:
      uVar11 = uVar8;
      if (!bVar3) {
        return 0;
      }
LAB_005c93ed:
      *p_end = uVar11;
      *p_col_count = uVar4;
      return 1;
    }
    if (bVar5) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
md_is_table_underline(MD_CTX* ctx, OFF beg, OFF* p_end, unsigned* p_col_count)
{
    OFF off = beg;
    int found_pipe = FALSE;
    unsigned col_count = 0;

    if(off < ctx->size  &&  CH(off) == _T('|')) {
        found_pipe = TRUE;
        off++;
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
    }

    while(1) {
        int delimited = FALSE;

        /* Cell underline ("-----", ":----", "----:" or ":----:") */
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;
        if(off >= ctx->size  ||  CH(off) != _T('-'))
            return FALSE;
        while(off < ctx->size  &&  CH(off) == _T('-'))
            off++;
        if(off < ctx->size  &&  CH(off) == _T(':'))
            off++;

        col_count++;
        if(col_count > TABLE_MAXCOLCOUNT) {
            MD_LOG("Suppressing table (column_count >" STRINGIZE(TABLE_MAXCOLCOUNT) ")");
            return FALSE;
        }

        /* Pipe delimiter (optional at the end of line). */
        while(off < ctx->size  &&  ISWHITESPACE(off))
            off++;
        if(off < ctx->size  &&  CH(off) == _T('|')) {
            delimited = TRUE;
            found_pipe =  TRUE;
            off++;
            while(off < ctx->size  &&  ISWHITESPACE(off))
                off++;
        }

        /* Success, if we reach end of line. */
        if(off >= ctx->size  ||  ISNEWLINE(off))
            break;

        if(!delimited)
            return FALSE;
    }

    if(!found_pipe)
        return FALSE;

    *p_end = off;
    *p_col_count = col_count;
    return TRUE;
}